

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * read_rna(string *input)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  vector<int,_std::allocator<int>_> *this;
  string *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  char byte;
  string line;
  ifstream fin;
  vector<int,_std::allocator<int>_> *rna;
  undefined4 in_stack_fffffffffffffd5c;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd70;
  char local_241;
  string local_240 [39];
  byte local_219;
  char local_218 [520];
  string *local_10;
  
  local_10 = in_RSI;
  std::ifstream::ifstream(local_218,in_RSI,_S_in);
  local_219 = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x132ad5);
  std::__cxx11::string::string(local_240);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) != 0) {
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) != 0) {
      while( true ) {
        this = (vector<int,_std::allocator<int>_> *)std::istream::get(local_218);
        bVar2 = std::ios::operator_cast_to_bool
                          ((ios *)((long)&(this->super__Vector_base<int,_std::allocator<int>_>).
                                          _M_impl.super__Vector_impl_data._M_start +
                                  *(long *)((this->super__Vector_base<int,_std::allocator<int>_>).
                                            _M_impl.super__Vector_impl_data._M_start + -6)));
        in_stack_fffffffffffffd5c = CONCAT13(bVar2,(int3)in_stack_fffffffffffffd5c);
        if (!bVar2) break;
        if ((local_241 != '\n') && (local_241 != '\r')) {
          iVar3 = to_int((char)((ulong)in_stack_fffffffffffffd70 >> 0x18));
          std::vector<int,_std::allocator<int>_>::push_back
                    (this,(value_type *)CONCAT44(in_stack_fffffffffffffd5c,iVar3));
        }
      }
    }
    local_219 = 1;
    std::__cxx11::string::~string(local_240);
    if ((local_219 & 1) == 0) {
      std::vector<int,_std::allocator<int>_>::~vector(in_stack_fffffffffffffd70);
    }
    std::ifstream::~ifstream(local_218);
    return in_RDI;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Could not open the RNA file - \'");
  poVar4 = std::operator<<(poVar4,local_10);
  poVar4 = std::operator<<(poVar4,"\'");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

vector<int> read_rna(string & input) {
    ifstream fin(input);
    vector<int> rna;
    string line;
    char byte;
    if (!fin.is_open()) {
        cout << "Could not open the RNA file - '" << input << "'" << endl;
        exit(1);
    }
    if (fin.is_open()) {

        while (fin.get(byte)) {
            if (byte != '\n' && byte != '\r') {
                rna.push_back(to_int(byte));
            }
        }
    }
    return rna;
}